

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O3

void __thiscall Assimp::FBX::Node::DumpPropertiesAscii(Node *this,ostream *s,int indent)

{
  ulong uVar1;
  pointer pFVar2;
  long lVar3;
  
  pFVar2 = (this->properties).
           super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->properties).
      super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(s,", ",2);
        pFVar2 = (this->properties).
                 super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      FBXExportProperty::DumpAscii((FBXExportProperty *)(&pFVar2->type + lVar3),s,indent);
      uVar1 = uVar1 + 1;
      pFVar2 = (this->properties).
               super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (uVar1 < (ulong)((long)(this->properties).
                                   super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 5));
  }
  return;
}

Assistant:

void FBX::Node::DumpPropertiesAscii(std::ostream &s, int indent)
{
    for (size_t i = 0; i < properties.size(); ++i) {
        if (i > 0) { s << ", "; }
        properties[i].DumpAscii(s, indent);
    }
}